

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# panning.cpp
# Opt level: O1

bool anon_unknown.dwarf_20cafe::MakeSpeakerMap
               (ALCdevice *device,AmbDecConf *conf,ALuint (*speakermap) [16])

{
  pointer pSVar1;
  int iVar2;
  long lVar3;
  uint *puVar4;
  uint *puVar5;
  uint uVar6;
  char *__format;
  pointer pSVar7;
  ALuint *pAVar8;
  bool bVar9;
  
  pSVar7 = (conf->Speakers).
           super__Vector_base<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (conf->Speakers).
           super__Vector_base<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pAVar8 = *speakermap;
  do {
    if (pSVar7 == pSVar1) {
      puVar5 = (uint *)(((long)(conf->Speakers).
                               super__Vector_base<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(conf->Speakers).
                               super__Vector_base<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333
                       + (long)speakermap);
      puVar4 = std::__find_if<unsigned_int*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                         (speakermap,puVar5);
      return puVar4 == puVar5;
    }
    iVar2 = std::__cxx11::string::compare((char *)pSVar7);
    if (iVar2 == 0) {
      lVar3 = 0;
LAB_0015ae8a:
      uVar6 = (device->RealOut).ChannelIndex._M_elems[lVar3];
      if (uVar6 == 0xffffffff) {
        __format = "[ALSOFT] (EE) Failed to lookup AmbDec speaker label %s\n";
        goto joined_r0x0015aea8;
      }
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)pSVar7);
      if (iVar2 == 0) {
        lVar3 = 1;
        goto LAB_0015ae8a;
      }
      iVar2 = std::__cxx11::string::compare((char *)pSVar7);
      if (iVar2 == 0) {
        lVar3 = 2;
        goto LAB_0015ae8a;
      }
      iVar2 = std::__cxx11::string::compare((char *)pSVar7);
      if (iVar2 == 0) {
        bVar9 = device->FmtChans != DevFmtX51Rear;
LAB_0015ae6e:
        lVar3 = (ulong)bVar9 * 3 + 4;
        goto LAB_0015ae8a;
      }
      iVar2 = std::__cxx11::string::compare((char *)pSVar7);
      if (iVar2 == 0) {
        bVar9 = device->FmtChans != DevFmtX51Rear;
LAB_0015ae82:
        lVar3 = (ulong)bVar9 * 3 + 5;
        goto LAB_0015ae8a;
      }
      iVar2 = std::__cxx11::string::compare((char *)pSVar7);
      if (iVar2 == 0) {
        bVar9 = device->FmtChans == DevFmtX51;
        goto LAB_0015ae6e;
      }
      iVar2 = std::__cxx11::string::compare((char *)pSVar7);
      if (iVar2 == 0) {
        bVar9 = device->FmtChans == DevFmtX51;
        goto LAB_0015ae82;
      }
      iVar2 = std::__cxx11::string::compare((char *)pSVar7);
      if (iVar2 == 0) {
        lVar3 = 6;
        goto LAB_0015ae8a;
      }
      uVar6 = 0xffffffff;
      __format = "[ALSOFT] (EE) AmbDec speaker label \"%s\" not recognized\n";
joined_r0x0015aea8:
      if (0 < (int)gLogLevel) {
        fprintf((FILE *)gLogFile,__format,(pSVar7->Name)._M_dataplus._M_p);
      }
    }
    *pAVar8 = uVar6;
    pSVar7 = pSVar7 + 1;
    pAVar8 = pAVar8 + 1;
  } while( true );
}

Assistant:

bool MakeSpeakerMap(ALCdevice *device, const AmbDecConf *conf, ALuint (&speakermap)[MAX_OUTPUT_CHANNELS])
{
    auto map_spkr = [device](const AmbDecConf::SpeakerConf &speaker) -> ALuint
    {
        /* NOTE: AmbDec does not define any standard speaker names, however
         * for this to work we have to by able to find the output channel
         * the speaker definition corresponds to. Therefore, OpenAL Soft
         * requires these channel labels to be recognized:
         *
         * LF = Front left
         * RF = Front right
         * LS = Side left
         * RS = Side right
         * LB = Back left
         * RB = Back right
         * CE = Front center
         * CB = Back center
         *
         * Additionally, surround51 will acknowledge back speakers for side
         * channels, and surround51rear will acknowledge side speakers for
         * back channels, to avoid issues with an ambdec expecting 5.1 to
         * use the side channels when the device is configured for back,
         * and vice-versa.
         */
        Channel ch{};
        if(speaker.Name == "LF")
            ch = FrontLeft;
        else if(speaker.Name == "RF")
            ch = FrontRight;
        else if(speaker.Name == "CE")
            ch = FrontCenter;
        else if(speaker.Name == "LS")
        {
            if(device->FmtChans == DevFmtX51Rear)
                ch = BackLeft;
            else
                ch = SideLeft;
        }
        else if(speaker.Name == "RS")
        {
            if(device->FmtChans == DevFmtX51Rear)
                ch = BackRight;
            else
                ch = SideRight;
        }
        else if(speaker.Name == "LB")
        {
            if(device->FmtChans == DevFmtX51)
                ch = SideLeft;
            else
                ch = BackLeft;
        }
        else if(speaker.Name == "RB")
        {
            if(device->FmtChans == DevFmtX51)
                ch = SideRight;
            else
                ch = BackRight;
        }
        else if(speaker.Name == "CB")
            ch = BackCenter;
        else
        {
            ERR("AmbDec speaker label \"%s\" not recognized\n", speaker.Name.c_str());
            return INVALID_CHANNEL_INDEX;
        }
        const ALuint chidx{GetChannelIdxByName(device->RealOut, ch)};
        if(chidx == INVALID_CHANNEL_INDEX)
            ERR("Failed to lookup AmbDec speaker label %s\n", speaker.Name.c_str());
        return chidx;
    };
    std::transform(conf->Speakers.begin(), conf->Speakers.end(), std::begin(speakermap), map_spkr);
    /* Return success if no invalid entries are found. */
    auto spkrmap_end = std::begin(speakermap) + conf->Speakers.size();
    return std::find(std::begin(speakermap), spkrmap_end, INVALID_CHANNEL_INDEX) == spkrmap_end;
}